

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cc
# Opt level: O0

void learn(mf *data,single_learner *base,example *ec)

{
  bool bVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  reference pbVar5;
  char *pcVar6;
  size_t sVar7;
  uchar *puVar8;
  v_array<float> *pvVar9;
  float *pfVar10;
  example *peVar11;
  v_array<unsigned_char> *in_RDX;
  long in_RDI;
  size_t i_2;
  features *fs_1;
  size_t k_1;
  size_t i_1;
  features *fs;
  size_t k;
  int right_ns;
  int left_ns;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  float predicted;
  features *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  example *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  example *local_78;
  ulong local_68;
  ulong local_60;
  example *in_stack_ffffffffffffffb0;
  ulong uVar12;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  mf *in_stack_ffffffffffffffc0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  long local_28;
  undefined1 local_1d;
  undefined4 local_1c;
  v_array<unsigned_char> *local_18;
  long local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  predict<true>(in_stack_ffffffffffffffc0,
                (single_learner *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                in_stack_ffffffffffffffb0);
  local_1c = *(undefined4 *)&local_18[0x342].end_array;
  LEARNER::learner<char,_example>::update
            ((learner<char,_example> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
             ,in_stack_ffffffffffffff68,
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  *(undefined4 *)&local_18[0x342].end_array = *(undefined4 *)((long)&local_18[0x345]._end + 4);
  copy_array<unsigned_char>
            ((v_array<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
             ,(v_array<unsigned_char> *)in_stack_ffffffffffffff68);
  v_array<unsigned_char>::clear
            ((v_array<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
            );
  local_1d = 0;
  v_array<unsigned_char>::push_back
            ((v_array<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
             ,(uchar *)in_stack_ffffffffffffff58);
  local_28 = local_8;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_30);
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)pbVar5);
    iVar3 = (int)*pcVar6;
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)pbVar5);
    iVar4 = (int)*pcVar6;
    sVar7 = features::size((features *)0x2a79a4);
    if ((sVar7 != 0) && (sVar7 = features::size((features *)0x2a79cb), sVar7 != 0)) {
      uVar2 = (uchar)iVar3;
      puVar8 = v_array<unsigned_char>::operator[](local_18,0);
      *puVar8 = uVar2;
      features::deep_copy_from
                ((features *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      for (uVar12 = 1; uVar12 <= *(ulong *)(local_8 + 0x18); uVar12 = uVar12 + 1) {
        pvVar9 = (v_array<float> *)((long)local_18 + (long)iVar3 * 0x68 + 0x20);
        for (local_60 = 0; sVar7 = features::size((features *)0x2a7a7a), local_60 < sVar7;
            local_60 = local_60 + 1) {
          pfVar10 = v_array<float>::operator[]((v_array<float> *)(local_8 + 0x28),uVar12 << 1);
          in_stack_ffffffffffffff74 = *pfVar10;
          pfVar10 = v_array<float>::operator[](pvVar9,local_60);
          *pfVar10 = in_stack_ffffffffffffff74 * *pfVar10;
        }
        LEARNER::learner<char,_example>::update
                  ((learner<char,_example> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68,
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        features::deep_copy_from
                  ((features *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
      }
      in_stack_ffffffffffffff70 = CONCAT13((char)iVar4,(int3)in_stack_ffffffffffffff70);
      puVar8 = v_array<unsigned_char>::operator[](local_18,0);
      *puVar8 = (uchar)((uint)in_stack_ffffffffffffff70 >> 0x18);
      features::deep_copy_from
                ((features *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      for (local_68 = 1; local_68 <= *(ulong *)(local_8 + 0x18); local_68 = local_68 + 1) {
        pvVar9 = (v_array<float> *)((long)local_18 + (long)iVar4 * 0x68 + 0x20);
        local_78 = (example *)0x0;
        while (in_stack_ffffffffffffff68 = local_78,
              peVar11 = (example *)features::size((features *)0x2a7bc2),
              in_stack_ffffffffffffff68 < peVar11) {
          pfVar10 = v_array<float>::operator[]((v_array<float> *)(local_8 + 0x28),local_68 * 2 - 1);
          in_stack_ffffffffffffff64 = *pfVar10;
          pfVar10 = v_array<float>::operator[](pvVar9,(size_t)local_78);
          *pfVar10 = in_stack_ffffffffffffff64 * *pfVar10;
          local_78 = (example *)((long)&(local_78->super_example_predict).indices._begin + 1);
        }
        LEARNER::learner<char,_example>::update
                  ((learner<char,_example> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68,
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        *(undefined4 *)&local_18[0x342].end_array = *(undefined4 *)((long)&local_18[0x345]._end + 4)
        ;
        features::deep_copy_from
                  ((features *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30);
  }
  copy_array<unsigned_char>
            ((v_array<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
             ,(v_array<unsigned_char> *)in_stack_ffffffffffffff68);
  *(undefined4 *)&local_18[0x342].end_array = local_1c;
  return;
}

Assistant:

void learn(mf& data, single_learner& base, example& ec)
{
  // predict with current weights
  predict<true>(data, base, ec);
  float predicted = ec.pred.scalar;

  // update linear weights
  base.update(ec);
  ec.pred.scalar = ec.updated_prediction;

  // store namespace indices
  copy_array(data.indices, ec.indices);

  // erase indices
  ec.indices.clear();
  ec.indices.push_back(0);

  // update interaction terms
  // looping over all pairs of non-empty namespaces
  for (string& i : data.pairs)
  {
    int left_ns = (int)i[0];
    int right_ns = (int)i[1];

    if (ec.feature_space[left_ns].size() > 0 && ec.feature_space[right_ns].size() > 0)
    {
      // set example to left namespace only
      ec.indices[0] = left_ns;

      // store feature values in left namespace
      data.temp_features.deep_copy_from(ec.feature_space[left_ns]);

      for (size_t k = 1; k <= data.rank; k++)
      {
        features& fs = ec.feature_space[left_ns];
        // multiply features in left namespace by r^k * x_r
        for (size_t i = 0; i < fs.size(); ++i) fs.values[i] *= data.sub_predictions[2 * k];

        // update l^k using base learner
        base.update(ec, k);

        // restore left namespace features (undoing multiply)
        fs.deep_copy_from(data.temp_features);

        // compute new l_k * x_l scaling factors
        // base.predict(ec, k);
        // data.sub_predictions[2*k-1] = ec.partial_prediction;
        // ec.pred.scalar = ec.updated_prediction;
      }

      // set example to right namespace only
      ec.indices[0] = right_ns;

      // store feature values for right namespace
      data.temp_features.deep_copy_from(ec.feature_space[right_ns]);

      for (size_t k = 1; k <= data.rank; k++)
      {
        features& fs = ec.feature_space[right_ns];
        // multiply features in right namespace by l^k * x_l
        for (size_t i = 0; i < fs.size(); ++i) fs.values[i] *= data.sub_predictions[2 * k - 1];

        // update r^k using base learner
        base.update(ec, k + data.rank);
        ec.pred.scalar = ec.updated_prediction;

        // restore right namespace features
        fs.deep_copy_from(data.temp_features);
      }
    }
  }
  // restore namespace indices
  copy_array(ec.indices, data.indices);

  // restore original prediction
  ec.pred.scalar = predicted;
}